

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

t_object * __thiscall xemmai::t_parser::f_symbol(t_parser *this)

{
  t_script *this_00;
  t_object *ptVar1;
  wstring_view wVar2;
  t_symbol *local_20;
  t_parser *this_local;
  
  this_00 = this->v_module;
  wVar2 = t_lexer::f_value(&this->v_lexer);
  local_20 = (t_symbol *)wVar2._M_len;
  wVar2._M_len = (size_t)wVar2._M_str;
  ptVar1 = t_symbol::f_instantiate(local_20,wVar2);
  ptVar1 = t_script::f_slot(this_00,ptVar1);
  return ptVar1;
}

Assistant:

t_object* f_symbol() const
	{
		return v_module.f_slot(t_symbol::f_instantiate(v_lexer.f_value()));
	}